

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,String *indentation,Enum cs,String *colonSymbol,
          String *nullSymbol,String *endingLineFeedSymbol,bool useSpecialFloats,bool emitUTF8,
          uint precision,PrecisionType precisionType)

{
  bool emitUTF8_local;
  bool useSpecialFloats_local;
  String *endingLineFeedSymbol_local;
  String *nullSymbol_local;
  String *colonSymbol_local;
  Enum cs_local;
  String *indentation_local;
  BuiltStyledStreamWriter *this_local;
  
  StreamWriter::StreamWriter(&this->super_StreamWriter);
  (this->super_StreamWriter)._vptr_StreamWriter =
       (_func_int **)&PTR__BuiltStyledStreamWriter_01690a80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->childValues_);
  std::__cxx11::string::string((string *)&this->indentString_);
  this->rightMargin_ = 0x4a;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)indentation);
  this->cs_ = cs;
  std::__cxx11::string::string((string *)&this->colonSymbol_,(string *)colonSymbol);
  std::__cxx11::string::string((string *)&this->nullSymbol_,(string *)nullSymbol);
  std::__cxx11::string::string
            ((string *)&this->endingLineFeedSymbol_,(string *)endingLineFeedSymbol);
  this->field_0xd8 = this->field_0xd8 & 0xfe;
  this->field_0xd8 = this->field_0xd8 & 0xfd;
  this->field_0xd8 = this->field_0xd8 & 0xfb | useSpecialFloats << 2;
  this->field_0xd8 = this->field_0xd8 & 0xf7 | emitUTF8 << 3;
  this->precision_ = precision;
  this->precisionType_ = precisionType;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
    String indentation, CommentStyle::Enum cs, String colonSymbol,
    String nullSymbol, String endingLineFeedSymbol, bool useSpecialFloats,
    bool emitUTF8, unsigned int precision, PrecisionType precisionType)
    : rightMargin_(74), indentation_(std::move(indentation)), cs_(cs),
      colonSymbol_(std::move(colonSymbol)), nullSymbol_(std::move(nullSymbol)),
      endingLineFeedSymbol_(std::move(endingLineFeedSymbol)),
      addChildValues_(false), indented_(false),
      useSpecialFloats_(useSpecialFloats), emitUTF8_(emitUTF8),
      precision_(precision), precisionType_(precisionType) {}